

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v11::detail::get_dynamic_spec<fmt::v11::context>
              (arg_id_kind kind,arg_ref<char> *ref,context *ctx)

{
  ulong uVar1;
  format_arg arg;
  
  if (kind == index) {
    basic_format_args<fmt::v11::context>::get(&arg,&ctx->args_,ref->index);
  }
  else {
    basic_format_args<fmt::v11::context>::get<char>(&arg,&ctx->args_,ref->name);
  }
  switch(arg.type_) {
  case none_type:
    report_error("argument not found");
  case int_type:
    uVar1 = (ulong)arg.value_.field_0.int_value;
    if ((long)uVar1 < 0) goto LAB_0017d72b;
    break;
  case uint_type:
    uVar1 = (ulong)arg.value_.field_0.uint_value;
    break;
  case long_long_type:
    uVar1 = 0xffffffffffffffff;
    if (-1 < arg.value_.field_0._4_4_) {
      uVar1 = CONCAT44(arg.value_.field_0.long_long_value._4_4_,arg.value_.field_0.int_value);
    }
    break;
  case int128_type:
    if (arg.value_.field_0._8_8_ < 0) goto LAB_0017d72b;
  case ulong_long_type:
  case uint128_type:
    uVar1 = CONCAT44(arg.value_.field_0.long_long_value._4_4_,arg.value_.field_0.int_value);
    break;
  default:
    report_error("width/precision is not integer");
  }
  if (uVar1 >> 0x1f == 0) {
    return (int)uVar1;
  }
LAB_0017d72b:
  report_error("width/precision is out of range");
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(
    arg_id_kind kind, const arg_ref<typename Context::char_type>& ref,
    Context& ctx) {
  FMT_ASSERT(kind != arg_id_kind::none, "");
  auto arg =
      kind == arg_id_kind::index ? ctx.arg(ref.index) : ctx.arg(ref.name);
  if (!arg) report_error("argument not found");
  unsigned long long value = arg.visit(dynamic_spec_getter());
  if (value > to_unsigned(max_value<int>()))
    report_error("width/precision is out of range");
  return static_cast<int>(value);
}